

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O1

Var Js::JavascriptMath::AddLeftDead
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptString *this;
  undefined7 extraout_var;
  Type *pTVar7;
  undefined4 extraout_var_01;
  undefined7 extraout_var_00;
  JavascriptString *pstRight;
  Var pvVar8;
  Type TVar9;
  ulong uVar10;
  double dVar11;
  Type TVar12;
  ulong uVar13;
  double dVar14;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00aaa7c0;
    *puVar5 = 0;
  }
  uVar10 = (ulong)aLeft & 0xffff000000000000;
  bVar2 = ((ulong)aLeft & 0x1ffff00000000) != 0x1000000000000;
  if (bVar2 && uVar10 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00aaa7c0;
    *puVar5 = 0;
  }
  TVar9 = TypeIds_FirstNumberType;
  if ((uVar10 != 0x1000000000000) && (TVar9 = TypeIds_Number, aLeft < (Var)0x4000000000000)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00aaa7c0;
      *puVar5 = 0;
    }
    TVar9 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar9) && (BVar4 = RecyclableObject::IsExternal(pRVar6), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00aaa7c0;
      *puVar5 = 0;
    }
  }
  if (TVar9 == TypeIds_String) {
    this = UnsafeVarTo<Js::JavascriptString>(aLeft);
    if (aRight == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00aaa7c0;
      *puVar5 = 0;
    }
    uVar13 = (ulong)aRight & 0xffff000000000000;
    pTVar7 = (Type *)CONCAT71(0xffff0000000000,uVar13 != 0x1000000000000);
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 && uVar13 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      pTVar7 = (Type *)CONCAT71(extraout_var,bVar3);
      if (!bVar3) goto LAB_00aaa7c0;
      *puVar5 = 0;
    }
    TVar12 = TypeIds_FirstNumberType;
    if (uVar13 != 0x1000000000000) {
      TVar12 = TypeIds_Number;
      pTVar7 = (Type *)0x3ffffffffffff;
      if (aRight < (Var)0x4000000000000) {
        pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aRight);
        if (pRVar6 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00aaa7c0;
          *puVar5 = 0;
        }
        pTVar7 = (pRVar6->type).ptr;
        TVar12 = pTVar7->typeId;
        if (0x57 < (int)TVar12) {
          BVar4 = RecyclableObject::IsExternal(pRVar6);
          pTVar7 = (Type *)CONCAT44(extraout_var_01,BVar4);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            pTVar7 = (Type *)CONCAT71(extraout_var_00,bVar3);
            if (!bVar3) goto LAB_00aaa7c0;
            *puVar5 = 0;
          }
        }
      }
    }
    if (TVar12 == TypeIds_FirstNumberType) {
      pstRight = ScriptContext::GetIntegerString(scriptContext,aRight);
LAB_00aaa53a:
      pTVar7 = (Type *)JavascriptString::ConcatDestructive(this,pstRight);
      bVar3 = false;
    }
    else {
      if (TVar12 == TypeIds_Number) {
        if (aRight < (Var)0x4000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                      ,0xd4,"(Is(aValue))",
                                      "Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar3) goto LAB_00aaa7c0;
          *puVar5 = 0;
        }
        pstRight = JavascriptNumber::ToStringRadix10
                             ((double)((ulong)aRight ^ 0xfffc000000000000),scriptContext);
        goto LAB_00aaa53a;
      }
      if (TVar12 == TypeIds_String) {
        pstRight = UnsafeVarTo<Js::JavascriptString>(aRight);
        goto LAB_00aaa53a;
      }
      bVar3 = true;
    }
    if (!bVar3) {
      return pTVar7;
    }
  }
  if (bVar2 && uVar10 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aaa7c0;
    *puVar5 = 0;
  }
  uVar13 = (ulong)aRight & 0xffff000000000000;
  bVar2 = ((ulong)aRight & 0x1ffff00000000) != 0x1000000000000;
  if (uVar10 == 0x1000000000000) {
    if (bVar2 && uVar13 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00aaa7c0:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (uVar13 == 0x1000000000000) {
      pvVar8 = TaggedInt::Add(aLeft,aRight,scriptContext);
      return pvVar8;
    }
    if (aRight < (Var)0x4000000000000) goto LAB_00aaa795;
    dVar14 = (double)(int)aLeft;
  }
  else {
    if (bVar2 && uVar13 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aaa7c0;
      *puVar5 = 0;
    }
    if (uVar13 == 0x1000000000000) {
      if (aLeft < (Var)0x4000000000000) goto LAB_00aaa795;
      dVar14 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      dVar11 = (double)(int)aRight;
      goto LAB_00aaa777;
    }
    if (aRight < (Var)0x4000000000000 || aLeft < (Var)0x4000000000000) {
LAB_00aaa795:
      pvVar8 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,result,TVar9 == TypeIds_String);
      return pvVar8;
    }
    dVar14 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  dVar11 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00aaa777:
  pvVar8 = JavascriptNumber::ToVarMaybeInPlace(dVar11 + dVar14,scriptContext,result);
  return pvVar8;
}

Assistant:

Var JavascriptMath::AddLeftDead(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber *result)
        {
            // Conservatively assume src1 is not dead until proven otherwise.
            bool leftIsDead = false;

            JIT_HELPER_REENTRANT_HEADER(Op_AddLeftDead);
            if (JavascriptOperators::GetTypeId(aLeft) == TypeIds_String)
            {
                leftIsDead = true;

                JavascriptString* leftString = UnsafeVarTo<JavascriptString>(aLeft);
                JavascriptString* rightString;
                TypeId rightType = JavascriptOperators::GetTypeId(aRight);
                switch(rightType)
                {
                    case TypeIds_String:
                        rightString = UnsafeVarTo<JavascriptString>(aRight);

StringCommon:
                        return leftString->ConcatDestructive(rightString);

                    case TypeIds_Integer:
                        rightString = scriptContext->GetIntegerString(aRight);
                        goto StringCommon;

                    case TypeIds_Number:
                        rightString = JavascriptNumber::ToStringRadix10(JavascriptNumber::GetValue(aRight), scriptContext);
                        goto StringCommon;
                }
            }

            if (TaggedInt::Is(aLeft))
            {
                if (TaggedInt::Is(aRight))
                {
                    return TaggedInt::Add(aLeft, aRight, scriptContext);
                }
                else if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
                {
                    return JavascriptNumber::ToVarMaybeInPlace(TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight), scriptContext, result);
                }
            }
            else if (TaggedInt::Is(aRight))
            {
                if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
                {
                    return JavascriptNumber::ToVarMaybeInPlace(JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight), scriptContext, result);
                }
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::ToVarMaybeInPlace(JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight), scriptContext, result);
            }
            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, result, leftIsDead);
            JIT_HELPER_END(Op_AddLeftDead);
        }